

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkShapes.cpp
# Opt level: O2

void __thiscall
CoreML::NeuralNetworkShaper::shapeReshapeLayer
          (NeuralNetworkShaper *this,NeuralNetworkLayer *specLayer)

{
  int index;
  Type *pTVar1;
  mapped_type *this_00;
  mapped_type *this_01;
  ReshapeLayerParams *from;
  ShapeRange *pSVar2;
  ShapeRange *other;
  size_t sVar3;
  ReshapeLayerParams reshape;
  ShapeRange local_40;
  
  pTVar1 = google::protobuf::internal::RepeatedPtrFieldBase::
           Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                     (&(specLayer->input_).super_RepeatedPtrFieldBase,0);
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
            ::operator[](&this->blobShapes,pTVar1);
  pTVar1 = google::protobuf::internal::RepeatedPtrFieldBase::
           Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                     (&(specLayer->output_).super_RepeatedPtrFieldBase,0);
  this_01 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
            ::operator[](&this->blobShapes,pTVar1);
  pTVar1 = google::protobuf::internal::RepeatedPtrFieldBase::
           Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                     (&(specLayer->output_).super_RepeatedPtrFieldBase,0);
  ShapeConstraint::setName(this_01,pTVar1);
  from = Specification::NeuralNetworkLayer::reshape(specLayer);
  Specification::ReshapeLayerParams::ReshapeLayerParams(&reshape,from);
  pSVar2 = ShapeConstraint::batchRange(this_00);
  ShapeConstraint::updateBatchRange(this_01,pSVar2);
  if (reshape.targetshape_.current_size_ == 3) {
    pSVar2 = ShapeConstraint::sequenceRange(this_01);
    other = ShapeConstraint::sequenceRange(this_00);
    ShapeRange::intersect(&local_40,pSVar2,other);
    ShapeConstraint::updateSequenceRange(this_01,&local_40);
    sVar3 = Specification::ReshapeLayerParams::targetshape(&reshape,0);
    ShapeConstraint::setChannel(this_01,sVar3);
    sVar3 = Specification::ReshapeLayerParams::targetshape(&reshape,1);
    ShapeConstraint::setHeight(this_01,sVar3);
    index = 2;
  }
  else {
    sVar3 = Specification::ReshapeLayerParams::targetshape(&reshape,0);
    ShapeRange::ShapeRange(&local_40,sVar3);
    ShapeConstraint::updateSequenceRange(this_01,&local_40);
    sVar3 = Specification::ReshapeLayerParams::targetshape(&reshape,1);
    ShapeConstraint::setChannel(this_01,sVar3);
    sVar3 = Specification::ReshapeLayerParams::targetshape(&reshape,2);
    ShapeConstraint::setHeight(this_01,sVar3);
    index = 3;
  }
  sVar3 = Specification::ReshapeLayerParams::targetshape(&reshape,index);
  ShapeConstraint::setWidth(this_01,sVar3);
  Specification::ReshapeLayerParams::~ReshapeLayerParams(&reshape);
  return;
}

Assistant:

void NeuralNetworkShaper::shapeReshapeLayer(const Specification::NeuralNetworkLayer& specLayer) {

    ShapeConstraint& inputShape = blobShapes[specLayer.input(0)];
    ShapeConstraint& outputShape = blobShapes[specLayer.output(0)];
    outputShape.setName(specLayer.output(0));

#if COREML_VALIDATOR_VERBOSE
    std::cout << "Reshape layer " << specLayer.name() << " input shapes (before): " << std::endl;
    std::cout << inputShape;
    std::cout << "Reshape layer " << specLayer.name() << " output shapes (before): " << std::endl;
    std::cout << outputShape;
#endif

    // TODO: there is some cross shape constraint here -- all 3 or 4 input ranges might be unconstrained, but now they are constrained to a combination whose product is
    // equal to the product of the output shapes

    Specification::ReshapeLayerParams reshape = specLayer.reshape();

    outputShape.updateBatchRange(inputShape.batchRange());

    if (reshape.targetshape_size() == 3) {
        outputShape.updateSequenceRange(outputShape.sequenceRange().intersect(inputShape.sequenceRange()));
        outputShape.setChannel(static_cast<size_t>(reshape.targetshape(0)));
        outputShape.setHeight(static_cast<size_t>(reshape.targetshape(1)));
        outputShape.setWidth(static_cast<size_t>(reshape.targetshape(2)));
    } else {
        outputShape.updateSequenceRange(static_cast<size_t>(reshape.targetshape(0)));
        outputShape.setChannel(static_cast<size_t>(reshape.targetshape(1)));
        outputShape.setHeight(static_cast<size_t>(reshape.targetshape(2)));
        outputShape.setWidth(static_cast<size_t>(reshape.targetshape(3)));
    }

#if COREML_VALIDATOR_VERBOSE
    std::cout << "Reshape layer " << specLayer.name() << " input shapes (after): " << std::endl;
    std::cout << inputShape;
    std::cout << "Reshape layer " << specLayer.name() << " output shapes (after): " << std::endl;
    std::cout << outputShape;
#endif

}